

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

object * __thiscall pybind11::object::operator=(object *this,object *other)

{
  PyObject *pPVar1;
  handle temp;
  handle local_10;
  
  local_10.m_ptr = (this->super_handle).m_ptr;
  pPVar1 = (other->super_handle).m_ptr;
  if (local_10.m_ptr != pPVar1) {
    if (pPVar1 != (PyObject *)0x0) {
      pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    }
    (this->super_handle).m_ptr = pPVar1;
    pybind11::handle::dec_ref(&local_10);
  }
  return this;
}

Assistant:

object &operator=(const object &other) {
        // Skip inc_ref and dec_ref if both objects are the same
        if (!this->is(other)) {
            other.inc_ref();
            // Use temporary variable to ensure `*this` remains valid while
            // `Py_XDECREF` executes, in case `*this` is accessible from Python.
            handle temp(m_ptr);
            m_ptr = other.m_ptr;
            temp.dec_ref();
        }
        return *this;
    }